

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_getColsByMask(void *highs,HighsInt *mask,HighsInt *num_col,double *costs,
                            double *lower,double *upper,HighsInt *num_nz,HighsInt *matrix_start,
                            HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  HighsInt local_28;
  HighsInt local_24;
  
  HVar1 = Highs::getCols((Highs *)highs,mask,&local_24,costs,lower,upper,&local_28,matrix_start,
                         matrix_index,matrix_value);
  *num_col = local_24;
  *num_nz = local_28;
  return HVar1;
}

Assistant:

HighsInt Highs_getColsByMask(const void* highs, const HighsInt* mask,
                             HighsInt* num_col, double* costs, double* lower,
                             double* upper, HighsInt* num_nz,
                             HighsInt* matrix_start, HighsInt* matrix_index,
                             double* matrix_value) {
  HighsInt local_num_col, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getCols(mask, local_num_col, costs, lower, upper, local_num_nz,
                    matrix_start, matrix_index, matrix_value);
  *num_col = local_num_col;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}